

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereLikeOptimizationStringFixup(Vdbe *v,WhereLevel *pLevel,WhereTerm *pTerm)

{
  uint uVar1;
  Op *pOVar2;
  
  if ((pTerm->wtFlags & 0x100) != 0) {
    if (v->db->mallocFailed == '\0') {
      pOVar2 = v->aOp + (long)v->nOp + -1;
    }
    else {
      pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    uVar1 = pLevel->iLikeRepCntr;
    pOVar2->p3 = uVar1 >> 1;
    pOVar2->p5 = (ushort)uVar1 & 1;
  }
  return;
}

Assistant:

static void whereLikeOptimizationStringFixup(
  Vdbe *v,                /* prepared statement under construction */
  WhereLevel *pLevel,     /* The loop that contains the LIKE operator */
  WhereTerm *pTerm        /* The upper or lower bound just coded */
){
  if( pTerm->wtFlags & TERM_LIKEOPT ){
    VdbeOp *pOp;
    assert( pLevel->iLikeRepCntr>0 );
    pOp = sqlite3VdbeGetLastOp(v);
    assert( pOp!=0 );
    assert( pOp->opcode==OP_String8
            || pTerm->pWC->pWInfo->pParse->db->mallocFailed );
    pOp->p3 = (int)(pLevel->iLikeRepCntr>>1);  /* Register holding counter */
    pOp->p5 = (u8)(pLevel->iLikeRepCntr&1);    /* ASC or DESC */
  }
}